

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeSpecial3LlSc(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint Reg;
  uint Reg_00;
  uint uVar1;
  int64_t Val;
  uint Base;
  uint Rt;
  int64_t Offset;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  Val = SignExtend64((ulong)(Insn >> 7 & 0x1ff),9);
  RegNo = fieldFromInstruction(Insn,0x10,5);
  RegNo_00 = fieldFromInstruction(Insn,0x15,5);
  Reg = getReg(Decoder,8,RegNo);
  Reg_00 = getReg(Decoder,8,RegNo_00);
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 != 0x55a) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 != 0x558) goto LAB_001db402;
  }
  MCOperand_CreateReg0(Inst,Reg);
LAB_001db402:
  MCOperand_CreateReg0(Inst,Reg);
  MCOperand_CreateReg0(Inst,Reg_00);
  MCOperand_CreateImm0(Inst,Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeSpecial3LlSc(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int64_t Offset = SignExtend64((Insn >> 7) & 0x1ff, 9);
	unsigned Rt = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Rt = getReg(Decoder, Mips_GPR32RegClassID, Rt);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	if (MCInst_getOpcode(Inst) == Mips_SC_R6 ||
			MCInst_getOpcode(Inst) == Mips_SCD_R6) {
		MCOperand_CreateReg0(Inst, Rt);
	}

	MCOperand_CreateReg0(Inst, Rt);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}